

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O3

void __thiscall ON_Material::Internal_CopyFrom(ON_Material *this,ON_Material *src)

{
  undefined8 uVar1;
  double dVar2;
  unsigned_short uVar3;
  unsigned_short uVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  
  uVar3 = (src->m_rdk_material_instance_id).Data2;
  uVar4 = (src->m_rdk_material_instance_id).Data3;
  uVar1 = *(undefined8 *)(src->m_rdk_material_instance_id).Data4;
  (this->m_rdk_material_instance_id).Data1 = (src->m_rdk_material_instance_id).Data1;
  (this->m_rdk_material_instance_id).Data2 = uVar3;
  (this->m_rdk_material_instance_id).Data3 = uVar4;
  *(undefined8 *)(this->m_rdk_material_instance_id).Data4 = uVar1;
  (this->m_ambient).field_0 = (src->m_ambient).field_0;
  (this->m_diffuse).field_0 = (src->m_diffuse).field_0;
  (this->m_emission).field_0 = (src->m_emission).field_0;
  (this->m_specular).field_0 = (src->m_specular).field_0;
  (this->m_reflection).field_0 = (src->m_reflection).field_0;
  (this->m_transparent).field_0 = (src->m_transparent).field_0;
  bVar5 = src->m_bDisableLighting;
  bVar6 = src->m_bUseDiffuseTextureAlphaForObjectTransparencyTexture;
  bVar7 = src->m_bFresnelReflections;
  this->m_bShareable = src->m_bShareable;
  this->m_bDisableLighting = bVar5;
  this->m_bUseDiffuseTextureAlphaForObjectTransparencyTexture = bVar6;
  this->m_bFresnelReflections = bVar7;
  dVar2 = src->m_shine;
  this->m_reflectivity = src->m_reflectivity;
  this->m_shine = dVar2;
  dVar2 = src->m_reflection_glossiness;
  this->m_transparency = src->m_transparency;
  this->m_reflection_glossiness = dVar2;
  dVar2 = src->m_index_of_refraction;
  this->m_refraction_glossiness = src->m_refraction_glossiness;
  this->m_index_of_refraction = dVar2;
  this->m_fresnel_index_of_refraction = src->m_fresnel_index_of_refraction;
  if (this != src) {
    ON_ClassArray<ON_Texture>::operator=
              (&(this->m_textures).super_ON_ClassArray<ON_Texture>,
               &(src->m_textures).super_ON_ClassArray<ON_Texture>);
  }
  ON_SimpleArray<ON_UuidIndex>::operator=(&this->m_material_channel,&src->m_material_channel);
  uVar3 = (src->m_plugin_id).Data2;
  uVar4 = (src->m_plugin_id).Data3;
  uVar1 = *(undefined8 *)(src->m_plugin_id).Data4;
  (this->m_plugin_id).Data1 = (src->m_plugin_id).Data1;
  (this->m_plugin_id).Data2 = uVar3;
  (this->m_plugin_id).Data3 = uVar4;
  *(undefined8 *)(this->m_plugin_id).Data4 = uVar1;
  return;
}

Assistant:

void ON_Material::Internal_CopyFrom(
  const ON_Material& src
  )
{
#define ON_COPY_SRC(m) m=src.m
  ON_COPY_SRC(m_rdk_material_instance_id);
  ON_COPY_SRC(m_ambient);
  ON_COPY_SRC(m_diffuse);
  ON_COPY_SRC(m_emission);
  ON_COPY_SRC(m_specular);
  ON_COPY_SRC(m_reflection);
  ON_COPY_SRC(m_transparent);
  ON_COPY_SRC(m_bShareable);
  ON_COPY_SRC(m_bDisableLighting);
  ON_COPY_SRC(m_bUseDiffuseTextureAlphaForObjectTransparencyTexture);
  ON_COPY_SRC(m_bFresnelReflections);
  ON_COPY_SRC(m_reflectivity);
  ON_COPY_SRC(m_shine);
  ON_COPY_SRC(m_transparency);
  ON_COPY_SRC(m_reflection_glossiness);
  ON_COPY_SRC(m_refraction_glossiness);
  ON_COPY_SRC(m_index_of_refraction);
  ON_COPY_SRC(m_fresnel_index_of_refraction);
  ON_COPY_SRC(m_textures);
  ON_COPY_SRC(m_material_channel);
  ON_COPY_SRC(m_plugin_id);
#undef ON_COPY_SRC
}